

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall ON_Plane::IsValid(ON_Plane *this)

{
  ON_PlaneEquation *this_00;
  bool bVar1;
  double dVar2;
  double dVar3;
  ON_3dVector N;
  ON_3dVector local_30;
  
  this_00 = &this->plane_equation;
  bVar1 = ON_PlaneEquation::IsValid(this_00);
  if ((bVar1) && (dVar2 = ON_PlaneEquation::ValueAt(this_00,this->origin), !NAN(dVar2))) {
    if (2.3283064365386963e-10 < ABS(dVar2)) {
      dVar3 = ON_3dPoint::MaximumCoordinate(&this->origin);
      dVar3 = ABS((this->plane_equation).d) + ABS(dVar3);
      if (dVar3 <= 1000.0) {
        return false;
      }
      bVar1 = ON_3dPoint::IsValid(&this->origin);
      if (dVar3 * 2.220446049250313e-15 < ABS(dVar2) || !bVar1) {
        return false;
      }
    }
    bVar1 = ON_IsRightHandFrame(&this->xaxis,&this->yaxis,&this->zaxis);
    if (bVar1) {
      ON_PlaneEquation::UnitNormal(&local_30,this_00);
      dVar2 = ON_DotProduct(&local_30,&this->zaxis);
      return ABS(dVar2 + -1.0) <= 1.490116119385e-08;
    }
  }
  return false;
}

Assistant:

bool ON_Plane::IsValid() const
{
  if ( !plane_equation.IsValid() )
    return false;


  double x = plane_equation.ValueAt(origin);
  if (ON_IS_NAN(x))
    return false;

  if ( fabs(x) >  ON_ZERO_TOLERANCE )
  {
    double tol = fabs(origin.MaximumCoordinate()) + fabs(plane_equation.d);
    if ( tol > 1000.0 && origin.IsValid() )
    {
      // 8 September 2003 Chuck and Dale:
      //   Fixing discrepancy between optimized and debug behavior.
      //   In this case, the ON_ZERO_TOLERANCE test worked in release
      //   and failed in debug. The principal behind this fix is valid
      //   for release builds too.
      //   For large point coordinates or planes far from the origin,
      //   the best we can hope for is to kill the first 15 or so decimal
      //   places.
      tol *= (ON_EPSILON*10.0);
      if ( fabs(x) > tol )
        return false;
    }
    else
      return false;
  }

  if ( !ON_IsRightHandFrame( xaxis, yaxis, zaxis ) )
    return false;

  const ON_3dVector N = plane_equation.UnitNormal();
  x = ON_DotProduct( N, zaxis );
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;

  return true;
}